

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O0

dtime_t duckdb::Interval::Add(dtime_t left,interval_t right,date_t *date)

{
  int *in_RCX;
  long in_RDX;
  long in_RDI;
  int64_t diff;
  long local_30;
  int *local_28;
  dtime_t local_10 [2];
  
  local_30 = in_RDX % 86400000000;
  local_28 = in_RCX;
  local_10[0].micros = in_RDI;
  dtime_t::operator+=(local_10,&local_30);
  if (local_10[0].micros < 86400000000) {
    if (local_10[0].micros < 0) {
      local_10[0].micros = local_10[0].micros + 86400000000;
      *local_28 = *local_28 + -1;
    }
  }
  else {
    local_10[0].micros = local_10[0].micros + -86400000000;
    *local_28 = *local_28 + 1;
  }
  return (dtime_t)local_10[0].micros;
}

Assistant:

dtime_t Interval::Add(dtime_t left, interval_t right, date_t &date) {
	int64_t diff = right.micros - ((right.micros / Interval::MICROS_PER_DAY) * Interval::MICROS_PER_DAY);
	left += diff;
	if (left.micros >= Interval::MICROS_PER_DAY) {
		left.micros -= Interval::MICROS_PER_DAY;
		date.days++;
	} else if (left.micros < 0) {
		left.micros += Interval::MICROS_PER_DAY;
		date.days--;
	}
	return left;
}